

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O1

void __thiscall cmWorkerPoolInternal::Work(cmWorkerPoolInternal *this,uint workerIndex)

{
  uint *puVar1;
  _Elt_pointer puVar2;
  _Head_base<0UL,_cmWorkerPool::JobT_*,_false> _Var3;
  _Head_base<0UL,_cmWorkerPool::JobT_*,_false> in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf;
  int __fd;
  unique_lock<std::mutex> *puVar4;
  int in_R8D;
  pointer __old_p;
  unique_lock<std::mutex> uLock;
  unique_lock<std::mutex> local_40;
  
  puVar4 = (unique_lock<std::mutex> *)(ulong)workerIndex;
  local_40._M_device = &this->Mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  __fd = (int)puVar4;
  local_40._M_owns = true;
  this->WorkersRunning = this->WorkersRunning + 1;
  __buf = extraout_RDX;
  if (this->Aborting == false) {
    do {
      puVar2 = (this->Queue).
               super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->Queue).
          super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar2) {
        this->WorkersIdle = this->WorkersIdle + 1;
        puVar4 = &local_40;
        std::condition_variable::wait((unique_lock *)&this->Condition);
        this->WorkersIdle = this->WorkersIdle - 1;
        __buf = extraout_RDX_01;
      }
      else {
        if ((this->FenceProcessing != false) ||
           (in_RCX._M_head_impl =
                 (puVar2->_M_t).
                 super___uniq_ptr_impl<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>
                 .super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl,
           (in_RCX._M_head_impl)->Fence_ == true)) {
          if (this->JobsProcessing != 0) {
            puVar4 = &local_40;
            std::condition_variable::wait((unique_lock *)&this->Condition);
            __buf = extraout_RDX_00;
            goto LAB_001d6bce;
          }
          this->FenceProcessing = true;
        }
        _Var3._M_head_impl =
             (puVar2->_M_t).
             super___uniq_ptr_impl<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
             super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl;
        (puVar2->_M_t).
        super___uniq_ptr_impl<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>._M_t.
        super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
        super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl = (JobT *)0x0;
        std::
        deque<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
        ::pop_front(&this->Queue);
        this->JobsProcessing = this->JobsProcessing + 1;
        std::unique_lock<std::mutex>::unlock(&local_40);
        (_Var3._M_head_impl)->Pool_ = this->Pool;
        (_Var3._M_head_impl)->WorkerIndex_ = workerIndex;
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_JobT + 0x10))(_Var3._M_head_impl);
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_JobT + 8))(_Var3._M_head_impl);
        std::unique_lock<std::mutex>::lock(&local_40);
        this->JobsProcessing = this->JobsProcessing - 1;
        __buf = extraout_RDX_02;
        if (this->FenceProcessing == true) {
          this->FenceProcessing = false;
          std::condition_variable::notify_all();
          __buf = extraout_RDX_03;
        }
      }
LAB_001d6bce:
      __fd = (int)puVar4;
    } while (this->Aborting == false);
  }
  puVar1 = &this->WorkersRunning;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    ::cm::uv_async_ptr::send(&this->UVRequestEnd,__fd,__buf,(size_t)in_RCX._M_head_impl,in_R8D);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void cmWorkerPoolInternal::Work(unsigned int workerIndex)
{
  cmWorkerPool::JobHandleT jobHandle;
  std::unique_lock<std::mutex> uLock(Mutex);
  // Increment running workers count
  ++WorkersRunning;
  // Enter worker main loop
  while (true) {
    // Abort on request
    if (Aborting) {
      break;
    }
    // Wait for new jobs
    if (Queue.empty()) {
      ++WorkersIdle;
      Condition.wait(uLock);
      --WorkersIdle;
      continue;
    }

    // Check for fence jobs
    if (FenceProcessing || Queue.front()->IsFence()) {
      if (JobsProcessing != 0) {
        Condition.wait(uLock);
        continue;
      }
      // No jobs get processed. Set the fence job processing flag.
      FenceProcessing = true;
    }

    // Pop next job from queue
    jobHandle = std::move(Queue.front());
    Queue.pop_front();

    // Unlocked scope for job processing
    ++JobsProcessing;
    {
      uLock.unlock();
      jobHandle->Work(Pool, workerIndex); // Process job
      jobHandle.reset();                  // Destroy job
      uLock.lock();
    }
    --JobsProcessing;

    // Was this a fence job?
    if (FenceProcessing) {
      FenceProcessing = false;
      Condition.notify_all();
    }
  }

  // Decrement running workers count
  if (--WorkersRunning == 0) {
    // Last worker thread about to finish. Send libuv event.
    UVRequestEnd.send();
  }
}